

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O3

void __thiscall
optimization::remove_dead_code::Remove_Dead_Code::optimize_mir
          (Remove_Dead_Code *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  string local_48;
  
  p_Var1 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(package->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,*(long *)(p_Var1 + 1),
                 (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
      optimize_func(this,&local_48,(MirFunction *)(p_Var1 + 2));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         ++iter) {
      optimize_func(iter->first, iter->second);
    }
  }